

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_finish_func(MIR_context_t ctx)

{
  byte bVar1;
  int iVar2;
  MIR_type_t MVar3;
  MIR_item_t_conflict func_item;
  MIR_error_func_t p_Var4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  MIR_op_mode_t MVar8;
  reg_desc_t *prVar9;
  MIR_func_t pMVar10;
  MIR_op_t *__ptr;
  MIR_func_t extraout_RAX;
  MIR_insn_t_conflict pMVar11;
  char *pcVar12;
  char cVar13;
  MIR_insn_t pMVar14;
  ulong uVar15;
  VARR_MIR_op_t *pVVar16;
  char *pcVar17;
  uint uVar18;
  ushort *puVar19;
  ulong uVar20;
  char *unaff_RBP;
  MIR_insn_t_conflict in_RSI;
  char *pcVar21;
  MIR_op_mode_t mode;
  MIR_error_type_t MVar22;
  MIR_context_t ctx_00;
  undefined2 uVar23;
  ulong unaff_R12;
  ulong unaff_R13;
  MIR_op_mode_t MVar25;
  MIR_error_func_t p_Var26;
  size_t sVar27;
  bool bVar28;
  bool bVar29;
  longdouble lVar30;
  int out_p;
  char *local_80;
  uint local_64;
  uint local_60;
  undefined1 local_58 [8];
  ushort uStack_50;
  longdouble local_3c;
  uint uVar24;
  
  pMVar10 = ctx->curr_func;
  if (pMVar10 == (MIR_func_t)0x0) {
    pcVar17 = "finish of non-existing function";
    MVar22 = MIR_no_func_error;
LAB_00132826:
    MVar8 = (*ctx->error_func)(MVar22,pcVar17);
LAB_0013282c:
    p_Var26 = ctx->error_func;
    pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
    pcVar21 = mode_str(MVar8);
    mode = 0x1a;
    (*p_Var26)(MIR_op_mode_error,
               "func %s: in instruction \'%s\': expected reg for operand #%d. Got \'%s\'",local_80,
               pcVar17,unaff_RBP,pcVar21);
LAB_00132869:
    ctx->curr_func = (MIR_func_t)0x0;
    p_Var4 = ctx->error_func;
    pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
    pcVar21 = mode_str(mode);
    pcVar12 = mode_str((MIR_op_mode_t)p_Var26);
    (*p_Var4)(MIR_op_mode_error,
              "func %s: in instruction \'%s\': unexpected operand mode for operand #%d. Got \'%s\', expected \'%s\'"
              ,local_80,pcVar17,unaff_RBP,pcVar21,pcVar12);
LAB_001328be:
    ctx->curr_func = (MIR_func_t)0x0;
    pcVar21 = "func %s: in instruction \'%s\': wrong type memory";
LAB_00132900:
    pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
    MVar22 = MIR_wrong_type_error;
LAB_0013295e:
    (*ctx->error_func)(MVar22,pcVar21,local_80,pcVar17);
LAB_00132969:
    MIR_finish_func_cold_2();
LAB_00132970:
    __assert_fail("insn->ops[i].u.ref->item_type == MIR_import_item || insn->ops[i].u.ref->item_type == MIR_export_item || insn->ops[i].u.ref->item_type == MIR_forward_item || insn->ops[i].u.ref->item_type == MIR_func_item"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x64d,"void MIR_finish_func(MIR_context_t)");
  }
  if (((pMVar10->vararg_p != '\0') || (pMVar10->nargs != 0)) ||
     (cVar13 = '\x01', pMVar10->nres != 1)) {
    cVar13 = '\0';
  }
  pMVar11 = (pMVar10->insns).head;
  if (pMVar11 == (MIR_insn_t_conflict)0x0) {
    bVar5 = false;
    bVar6 = false;
  }
  else {
    local_80 = pMVar10->name;
    bVar6 = false;
    bVar5 = false;
    do {
      unaff_R13 = *(ulong *)&pMVar11->field_0x18;
      uVar24 = (uint)unaff_R13;
      if (uVar24 == 0xab) {
        bVar5 = true;
      }
      if (uVar24 == 0xac) {
        bVar6 = true;
      }
      if (uVar24 - 0xb9 < 2) {
LAB_001327fb:
        pcVar17 = "use or phi can be used only internally";
        ctx->curr_func = (MIR_func_t)0x0;
LAB_00132821:
        MVar22 = MIR_vararg_func_error;
        goto LAB_00132826;
      }
      pMVar10 = ctx->curr_func;
      if ((uVar24 == 0xb2) && (pMVar10->vararg_p == '\0')) {
        ctx->curr_func = (MIR_func_t)0x0;
        pcVar17 = "va_start is not in vararg function";
        goto LAB_00132821;
      }
      if ((uVar24 == 0xac) && (pMVar10->nres != 0)) {
LAB_00132940:
        ctx->curr_func = (MIR_func_t)0x0;
        pcVar21 = "func %s: in insn \'%s\': function should not have results in this case";
        pcVar17 = "jret";
        MVar22 = MIR_vararg_func_error;
        goto LAB_0013295e;
      }
      in_RSI = (MIR_insn_t_conflict)CONCAT71((int7)((ulong)in_RSI >> 8),uVar24 == 0xac);
      if ((uVar24 == 0xac && bVar5) || (uVar24 == 0xab && bVar6)) {
        ctx->curr_func = (MIR_func_t)0x0;
        (*ctx->error_func)(MIR_vararg_func_error,"func %s: mix of RET and JRET insns",local_80);
        goto LAB_001327fb;
      }
      unaff_R12 = unaff_R13 >> 0x20;
      if (uVar24 == 0xab) {
        if ((uint32_t)(unaff_R13 >> 0x20) != pMVar10->nres) {
          ctx->curr_func = (MIR_func_t)0x0;
          (*ctx->error_func)(MIR_vararg_func_error,
                             "func %s: in instruction \'%s\': number of operands in return does not correspond number of function returns. Expected %d, got %d"
                             ,local_80,"ret",(ulong)_DAT_00000038,unaff_R12);
          goto LAB_00132940;
        }
      }
      else if (uVar24 - 0xaa < 0xfffffffd) {
        pMVar14 = pMVar11;
        if (uVar24 - 0xa1 < 4) {
          do {
            pMVar14 = (pMVar14->insn_link).prev;
            if (pMVar14 == (MIR_insn_t)0x0) goto LAB_00132758;
            uVar18 = *(uint *)&pMVar14->field_0x18;
            uVar20 = (ulong)uVar18;
          } while ((uVar20 == 0) && (*(char *)&pMVar14[1].insn_link.prev == '\x01'));
          if (uVar18 - 0x76 < 0xfffffff8) {
LAB_00132758:
            pcVar21 = 
            "func %s: instruction \'%s\' has no previous overflow insn separated only by stores and reg moves"
            ;
            MVar22 = MIR_invalid_insn_error;
            pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
            goto LAB_0013295e;
          }
          if ((((char)unaff_R13 == -0x5e) || ((uVar24 & 0xff) == 0xa4)) && ((uVar18 & 0x7e) == 0x72)
             ) {
            pcVar21 = 
            "func %s: unsigned overflow branch \'%s\' consumes flag of signed overflow insn \'%s\'";
            unaff_RBP = insn_descs[uVar20].name;
            pcVar17 = insn_descs[uVar24 & 0xa6].name;
LAB_001329b7:
            MVar22 = MIR_invalid_insn_error;
LAB_00132714:
            (*ctx->error_func)(MVar22,pcVar21,local_80,pcVar17,unaff_RBP);
LAB_0013271a:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x692,"void MIR_finish_func(MIR_context_t)");
          }
          if (((uVar24 & 0xa5) == 0xa1) && ((uVar18 & 0x7e) == 0x74)) {
            pcVar21 = 
            "func %s: signed overflow branch \'%s\' consumes flag of unsigned overflow insn \'%s\'";
            pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
            unaff_RBP = insn_descs[uVar20].name;
            goto LAB_001329b7;
          }
        }
      }
      else {
        cVar13 = '\0';
      }
      if (unaff_R12 != 0) {
        uVar18 = uVar24 - 0xaa;
        puVar19 = (ushort *)&pMVar11->ops[0].field_0x8;
        unaff_RBP = (char *)0x1;
        local_3c = (longdouble)CONCAT64(local_3c._4_6_,uVar18);
        unaff_R12 = -unaff_R12;
        do {
          if (unaff_RBP == (char *)0x1 && uVar24 == 0xb5) {
            if (pMVar11->ops[0].field_0x8 != '\x03') {
              __assert_fail("insn->ops[i].mode == MIR_OP_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x642,"void MIR_finish_func(MIR_context_t)");
            }
          }
          else if (uVar18 < 0xfffffffd) {
            if (unaff_RBP == (char *)0x3 && uVar24 == 0xb0) {
              if (*(char *)((long)&pMVar11[1].ops[0].u + 8) != '\n') {
                __assert_fail("insn->ops[i].mode == MIR_OP_MEM",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x652,"void MIR_finish_func(MIR_context_t)");
              }
            }
            else {
              if (uVar24 == 0xaa) {
                _local_58 = (longdouble)((unkuint10)stack0xffffffffffffffac << 0x20);
                p_Var26 = (MIR_error_func_t)((ulong)(unaff_RBP != (char *)0x1) * 9 + 3);
              }
              else {
                if (uVar24 != 0xab) goto LAB_00132194;
                _local_58 = (longdouble)((unkuint10)stack0xffffffffffffffac << 0x20);
                MVar3 = ctx->curr_func->res_types[(long)(unaff_RBP + -1)];
                if (MVar3 == MIR_T_F) {
                  p_Var26 = (MIR_error_func_t)0x5;
                }
                else if (MVar3 == MIR_T_D) {
                  p_Var26 = (MIR_error_func_t)0x6;
                }
                else {
                  p_Var26 = (MIR_error_func_t)0x0;
                  if (MVar3 != MIR_T_UNDEF) {
                    p_Var26 = (MIR_error_func_t)(ulong)((uint)(MVar3 == MIR_T_LD) * 4 + 3);
                  }
                }
              }
LAB_001321ab:
              uVar7 = (ushort)(byte)*puVar19;
              if (uVar7 < 10) {
                if (uVar7 == 1) {
                  in_RSI = (MIR_insn_t_conflict)(ulong)*(uint *)(puVar19 + 4);
                  prVar9 = find_rd_by_reg(ctx,*(uint *)(puVar19 + 4),ctx->curr_func);
                  if ((prVar9 == (reg_desc_t *)0x0) || (*(MIR_reg_t *)(puVar19 + 4) != prVar9->reg))
                  {
                    __assert_fail("rd != ((void*)0) && insn->ops[i].u.reg == rd->reg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                  ,0x662,"void MIR_finish_func(MIR_context_t)");
                  }
                  MVar3 = prVar9->type;
                  bVar29 = true;
                  if (MVar3 == MIR_T_F) {
                    mode = MIR_OP_FLOAT;
                  }
                  else if (MVar3 == MIR_T_D) {
                    mode = MIR_OP_DOUBLE;
                  }
                  else {
                    mode = MIR_OP_UNDEF;
                    if (MVar3 == MIR_T_UNDEF) goto LAB_00132361;
                    bVar28 = MVar3 == MIR_T_LD;
LAB_00132357:
                    bVar29 = true;
                    mode = (uint)bVar28 * 4 + MIR_OP_INT;
                  }
                }
                else {
                  bVar29 = uVar7 == 2;
LAB_00132304:
                  if (bVar29) goto LAB_0013271a;
                  if ((uVar7 & 0xfffe) == 8) {
                    uVar7 = 3;
                  }
                  bVar29 = false;
                  mode = (MIR_op_mode_t)uVar7;
                }
              }
              else {
                if (uVar7 != 10) {
                  bVar29 = uVar7 == 0xb;
                  goto LAB_00132304;
                }
                if (0xb < (byte)puVar19[4]) {
                  if ((local_3c._0_4_ < 0xfffffffd) || ((byte)puVar19[4] - 0x12 < 0xfffffffa))
                  goto LAB_001328be;
                  if (*(long *)(puVar19 + 0x10) < 0) {
                    ctx->curr_func = (MIR_func_t)0x0;
                    pcVar21 = "func %s: in instruction \'%s\': block type memory with disp < 0";
                    goto LAB_00132900;
                  }
                }
                if (*(MIR_reg_t *)(puVar19 + 0xc) != 0) {
                  prVar9 = find_rd_by_reg(ctx,*(MIR_reg_t *)(puVar19 + 0xc),ctx->curr_func);
                  if ((prVar9 == (reg_desc_t *)0x0) ||
                     (*(MIR_reg_t *)(puVar19 + 0xc) != prVar9->reg)) {
                    __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.base == rd->reg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                  ,0x676,"void MIR_finish_func(MIR_context_t)");
                  }
                  if ((MIR_T_UNDEF < prVar9->type) || ((0x40700U >> (prVar9->type & 0x1f) & 1) == 0)
                     ) goto LAB_00132296;
                  ctx->curr_func = (MIR_func_t)0x0;
                  pcVar21 = 
                  "func %s: in instruction \'%s\': base reg of non-integer type for operand #%d";
LAB_00132702:
                  pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
                  MVar22 = MIR_reg_type_error;
                  goto LAB_00132714;
                }
LAB_00132296:
                uVar18 = *(uint *)(puVar19 + 0xe);
                in_RSI = (MIR_insn_t_conflict)(ulong)uVar18;
                if (uVar18 != 0) {
                  prVar9 = find_rd_by_reg(ctx,uVar18,ctx->curr_func);
                  if ((prVar9 == (reg_desc_t *)0x0) ||
                     (*(MIR_reg_t *)(puVar19 + 0xe) != prVar9->reg)) {
                    __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.index == rd->reg",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                                  ,0x682,"void MIR_finish_func(MIR_context_t)");
                  }
                  if ((prVar9->type < MIR_T_BOUND) && ((0x40700U >> (prVar9->type & 0x1f) & 1) != 0)
                     ) {
                    ctx->curr_func = (MIR_func_t)0x0;
                    pcVar21 = 
                    "func %s: in instruction \'%s\': index reg of non-integer type for operand #%d";
                    goto LAB_00132702;
                  }
                }
                bVar1 = (byte)puVar19[4];
                bVar29 = true;
                if (bVar1 == 8) {
                  mode = MIR_OP_FLOAT;
                }
                else {
                  if (bVar1 != 9) {
                    cVar13 = '\0';
                    if (bVar1 != 0x12) {
                      bVar28 = bVar1 == 10;
                      cVar13 = '\0';
                      goto LAB_00132357;
                    }
                    mode = MIR_OP_UNDEF;
                    goto LAB_00132361;
                  }
                  mode = MIR_OP_DOUBLE;
                }
                cVar13 = '\0';
              }
LAB_00132361:
              bVar1 = (byte)*puVar19;
              MVar8 = (MIR_op_mode_t)bVar1;
              *puVar19 = (ushort)(mode << 8) | (ushort)bVar1;
              MVar25 = (MIR_op_mode_t)p_Var26;
              if ((mode == MIR_OP_UNDEF) && (bVar1 == 10)) {
                in_RSI = (MIR_insn_t_conflict)
                         CONCAT71((int7)((ulong)in_RSI >> 8),unaff_RBP == (char *)0x1);
                if ((uVar24 != 0xb2 || unaff_RBP != (char *)0x1) &&
                   (unaff_RBP != (char *)0x2 || uVar24 != 0xb3 && (uVar24 & 0xfffffffe) != 0xb0))
                goto LAB_0013239d;
                *puVar19 = (ushort)(MVar25 << 8) | 10;
              }
              else {
LAB_0013239d:
                if ((char)p_Var26 != '\0') {
                  if ((MVar25 & 0xff) == MIR_OP_REG) {
                    if (1 < (ushort)(bVar1 - 1)) goto LAB_0013282c;
                  }
                  else {
                    MVar8 = mode;
                    if (mode == MIR_OP_UINT) {
                      MVar8 = MIR_OP_INT;
                    }
                    if (MVar8 != MVar25) goto LAB_00132869;
                  }
                }
              }
              uVar18 = local_3c._0_4_;
              if (!bVar29 && local_58._0_4_ != 0) {
                ctx->curr_func = (MIR_func_t)0x0;
                pcVar21 = "func %s; in instruction \'%s\': wrong operand #%d for insn output";
                MVar22 = MIR_out_op_error;
                pcVar17 = insn_descs[unaff_R13 & 0xffffffff].name;
                goto LAB_00132714;
              }
            }
          }
          else if (unaff_RBP == (char *)0x1) {
            if ((pMVar11->ops[0].field_0x8 != '\b') ||
               ((pMVar11->ops[0].u.ref)->item_type != MIR_proto_item)) {
              __assert_fail("insn->ops[i].mode == MIR_OP_REF && insn->ops[i].u.ref->item_type == MIR_proto_item"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x647,"void MIR_finish_func(MIR_context_t)");
            }
          }
          else {
            if ((unaff_RBP != (char *)0x2) || (*(char *)&pMVar11[1].insn_link.prev != '\b')) {
LAB_00132194:
              in_RSI = pMVar11;
              MVar8 = MIR_insn_op_mode(ctx,pMVar11,(size_t)(unaff_RBP + -1),(int *)local_58);
              p_Var26 = (MIR_error_func_t)(ulong)MVar8;
              goto LAB_001321ab;
            }
            iVar2 = *(int *)&(pMVar11[1].insn_link.next)->ops[0].data;
            if ((2 < iVar2 - 2U) && (iVar2 != 0)) goto LAB_00132970;
          }
          pcVar17 = unaff_RBP + unaff_R12 + 1;
          puVar19 = puVar19 + 0x18;
          unaff_RBP = unaff_RBP + 1;
        } while (pcVar17 != (char *)0x1);
      }
      pMVar11 = (pMVar11->insn_link).next;
    } while (pMVar11 != (MIR_insn_t)0x0);
    pMVar10 = ctx->curr_func;
  }
  if ((bVar6 || bVar5) ||
     ((pMVar11 = (pMVar10->insns).tail, pMVar11 != (MIR_insn_t_conflict)0x0 &&
      (*(int *)&pMVar11->field_0x18 == 0x76)))) goto LAB_00132632;
  pVVar16 = ctx->temp_ops;
  if ((pVVar16 == (VARR_MIR_op_t *)0x0) || (pVVar16->varr == (MIR_op_t *)0x0)) {
    MIR_finish_func_cold_3();
    if (in_RSI == (MIR_insn_t_conflict)0x0) {
      __assert_fail("insn != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x816,"size_t MIR_insn_nops(MIR_context_t, MIR_insn_t)");
    }
    return;
  }
  pVVar16->els_num = 0;
  ctx_00 = ctx;
  if (pMVar10->nres == 0) {
LAB_001325ff:
    sVar27 = 0;
  }
  else {
    local_64 = (uint)pVVar16;
    uVar20 = 0;
    local_60 = local_64;
    do {
      MVar3 = pMVar10->res_types[uVar20];
      if (MVar3 == MIR_T_LD) {
        _local_58 = (longdouble)0;
        uVar23 = 7;
      }
      else if (MVar3 == MIR_T_D) {
        _local_58 = (longdouble)((unkuint10)uStack_50 << 0x40);
        uVar24 = (uint)unaff_R12 & 0xffffff00 | 6;
        uVar23 = (undefined2)uVar24;
        unaff_R12 = (ulong)uVar24;
      }
      else if (MVar3 == MIR_T_F) {
        _local_58 = (longdouble)((unkuint10)stack0xffffffffffffffac << 0x20);
        local_64 = local_64 & 0xffffff00 | 5;
        uVar23 = (undefined2)local_64;
      }
      else {
        _local_58 = (longdouble)((unkuint10)uStack_50 << 0x40);
        local_60 = local_60 & 0xffffff00 | 3;
        uVar23 = (undefined2)local_60;
      }
      pVVar16 = ctx->temp_ops;
      __ptr = pVVar16->varr;
      if (__ptr == (MIR_op_t *)0x0) goto LAB_00132969;
      sVar27 = pVVar16->els_num;
      uVar15 = sVar27 + 1;
      lVar30 = _local_58;
      if (pVVar16->size < uVar15) {
        local_3c = _local_58;
        sVar27 = (uVar15 >> 1) + uVar15;
        __ptr = (MIR_op_t *)realloc(__ptr,sVar27 * 0x30);
        pVVar16->varr = __ptr;
        pVVar16->size = sVar27;
        sVar27 = pVVar16->els_num;
        uVar15 = sVar27 + 1;
        lVar30 = local_3c;
      }
      pVVar16->els_num = uVar15;
      uVar20 = uVar20 + 1;
      __ptr[sVar27].data = (void *)0x0;
      *(undefined2 *)&__ptr[sVar27].field_0x8 = uVar23;
      *(longdouble *)&__ptr[sVar27].u = lVar30;
      pMVar10 = ctx->curr_func;
      sVar27 = (size_t)pMVar10->nres;
    } while (uVar20 < sVar27);
    pVVar16 = ctx->temp_ops;
    if (pVVar16 == (VARR_MIR_op_t *)0x0) {
      MIR_finish_func_cold_1();
      pMVar10 = extraout_RAX;
      goto LAB_001325ff;
    }
  }
  func_item = pMVar10->func_item;
  pMVar11 = MIR_new_insn_arr(ctx_00,MIR_RET,sVar27,pVVar16->varr);
  MIR_append_insn(ctx,func_item,pMVar11);
  pMVar10 = ctx->curr_func;
LAB_00132632:
  pMVar10->expr_p = cVar13;
  pMVar10->jret_p = bVar6;
  ctx->curr_func = (MIR_func_t)0x0;
  return;
}

Assistant:

void MIR_finish_func (MIR_context_t ctx) {
  int expr_p = TRUE;
  MIR_insn_t insn, prev_insn;
  MIR_insn_code_t code;
  const char *func_name;
  int ret_p = FALSE, jret_p = FALSE;

  if (curr_func == NULL)
    MIR_get_error_func (ctx) (MIR_no_func_error, "finish of non-existing function");
  func_name = curr_func->name;
  if (curr_func->vararg_p || curr_func->nargs != 0 || curr_func->nres != 1) expr_p = FALSE;
  for (insn = DLIST_HEAD (MIR_insn_t, curr_func->insns); insn != NULL;
       insn = DLIST_NEXT (MIR_insn_t, insn)) {
    size_t i, actual_nops = MIR_insn_nops (ctx, insn);
    MIR_op_mode_t mode, expected_mode;
    reg_desc_t *rd;
    int out_p, can_be_out_p;

    code = insn->code;
    if (code == MIR_RET) ret_p = TRUE;
    if (code == MIR_JRET) jret_p = TRUE;
    if (code == MIR_PHI || code == MIR_USE) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "use or phi can be used only internally");
    } else if (!curr_func->vararg_p && code == MIR_VA_START) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "va_start is not in vararg function");
    } else if (code == MIR_JRET && curr_func->nres != 0) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in insn '%s': function should not have results in this case", func_name,
              insn_descs[code].name);
    } else if ((code == MIR_JRET && ret_p) || (code == MIR_RET && jret_p)) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "func %s: mix of RET and JRET insns",
                                func_name);
    } else if (code == MIR_RET && actual_nops != curr_func->nres) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in instruction '%s': number of operands in return does not "
              "correspond number of function returns. Expected %d, got %d",
              func_name, insn_descs[code].name, curr_func->nres, actual_nops);
    } else if (MIR_call_code_p (code)) {
      expr_p = FALSE;
    } else if (code == MIR_BO || code == MIR_UBO || code == MIR_BNO || code == MIR_UBNO) {
      for (prev_insn = DLIST_PREV (MIR_insn_t, insn); prev_insn != NULL;
           prev_insn = DLIST_PREV (MIR_insn_t, prev_insn))
        if (prev_insn->code != MIR_MOV || prev_insn->ops[1].mode != MIR_OP_REG) break;
      if (prev_insn == NULL || !MIR_overflow_insn_code_p (prev_insn->code))
        MIR_get_error_func (ctx) (MIR_invalid_insn_error,
                                  "func %s: instruction '%s' has no previous overflow insn "
                                  "separated only by stores and reg moves",
                                  func_name, insn_descs[code].name);
      else if ((code == MIR_UBO || code == MIR_UBNO)
               && (prev_insn->code == MIR_MULO || prev_insn->code == MIR_MULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: unsigned overflow branch '%s' consumes flag of signed overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
      else if ((code == MIR_BO || code == MIR_BNO)
               && (prev_insn->code == MIR_UMULO || prev_insn->code == MIR_UMULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: signed overflow branch '%s' consumes flag of unsigned overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
    }
    for (i = 0; i < actual_nops; i++) {
      if (code == MIR_UNSPEC && i == 0) {
        mir_assert (insn->ops[i].mode == MIR_OP_INT);
        continue;
      } else if (MIR_call_code_p (code)) {
        if (i == 0) {
          mir_assert (insn->ops[i].mode == MIR_OP_REF
                      && insn->ops[i].u.ref->item_type == MIR_proto_item);
          continue; /* We checked the operand during insn creation -- skip the prototype */
        } else if (i == 1 && insn->ops[i].mode == MIR_OP_REF) {
          mir_assert (insn->ops[i].u.ref->item_type == MIR_import_item
                      || insn->ops[i].u.ref->item_type == MIR_export_item
                      || insn->ops[i].u.ref->item_type == MIR_forward_item
                      || insn->ops[i].u.ref->item_type == MIR_func_item);
          continue; /* We checked the operand during insn creation -- skip the func */
        }
      }
      if (code == MIR_VA_ARG && i == 2) {
        mir_assert (insn->ops[i].mode == MIR_OP_MEM);
        continue; /* We checked the operand during insn creation -- skip va_arg type  */
      }
      if (code == MIR_SWITCH) {
        out_p = FALSE;
        expected_mode = i == 0 ? MIR_OP_INT : MIR_OP_LABEL;
      } else if (code == MIR_RET) {
        out_p = FALSE;
        expected_mode = type2mode (curr_func->res_types[i]);
      } else {
        expected_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      }
      can_be_out_p = TRUE;
      switch (insn->ops[i].mode) {
      case MIR_OP_REG:
        rd = find_rd_by_reg (ctx, insn->ops[i].u.reg, curr_func);
        mir_assert (rd != NULL && insn->ops[i].u.reg == rd->reg);
        mode = type2mode (rd->type);
        break;
      case MIR_OP_MEM:
        expr_p = FALSE;
        if (wrong_type_p (insn->ops[i].u.mem.type)
            && (!MIR_all_blk_type_p (insn->ops[i].u.mem.type) || !MIR_call_code_p (code))) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': wrong type memory", func_name,
                                    insn_descs[code].name);
        }
        if (MIR_all_blk_type_p (insn->ops[i].u.mem.type) && insn->ops[i].u.mem.disp < 0) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': block type memory with disp < 0",
                                    func_name, insn_descs[code].name);
        }
        if (insn->ops[i].u.mem.base != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.base, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.base == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': base reg of non-integer type for operand "
                    "#%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        if (insn->ops[i].u.mem.index != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.index, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.index == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': index reg of non-integer type for "
                    "operand #%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        mode = type2mode (insn->ops[i].u.mem.type);
        break;
      case MIR_OP_VAR:
      case MIR_OP_VAR_MEM:
        expr_p = FALSE;
        mode = expected_mode;
        mir_assert (FALSE); /* Should not be here */
        break;
      default:
        can_be_out_p = FALSE;
        mode = insn->ops[i].mode;
        if (mode == MIR_OP_REF || mode == MIR_OP_STR) mode = MIR_OP_INT; /* just an address */
        break;
      }
      insn->ops[i].value_mode = mode;
      if (mode == MIR_OP_UNDEF && insn->ops[i].mode == MIR_OP_MEM
          && ((code == MIR_VA_START && i == 0)
              || ((code == MIR_VA_ARG || code == MIR_VA_BLOCK_ARG) && i == 1)
              || (code == MIR_VA_END && i == 1))) { /* a special case: va_list as undef type mem */
        insn->ops[i].value_mode = expected_mode;
      } else if (expected_mode == MIR_OP_REG) {
        if (insn->ops[i].mode != MIR_OP_REG && insn->ops[i].mode != MIR_OP_VAR)
          MIR_get_error_func (
            ctx) (MIR_op_mode_error,
                  "func %s: in instruction '%s': expected reg for operand #%d. Got '%s'", func_name,
                  insn_descs[code].name, i + 1, mode_str (insn->ops[i].mode));
      } else if (expected_mode != MIR_OP_UNDEF
                 && (mode == MIR_OP_UINT ? MIR_OP_INT : mode) != expected_mode) {
        curr_func = NULL;
        MIR_get_error_func (
          ctx) (MIR_op_mode_error,
                "func %s: in instruction '%s': unexpected operand mode for operand #%d. Got "
                "'%s', expected '%s'",
                func_name, insn_descs[code].name, i + 1, mode_str (mode), mode_str (expected_mode));
      }
      if (out_p && !can_be_out_p) {
        curr_func = NULL;
        MIR_get_error_func (ctx) (MIR_out_op_error,
                                  "func %s; in instruction '%s': wrong operand #%d for insn output",
                                  func_name, insn_descs[code].name, i + 1);
      }
    }
  }
  if (!ret_p && !jret_p
      && ((insn = DLIST_TAIL (MIR_insn_t, curr_func->insns)) == NULL || insn->code != MIR_JMP)) {
    VARR_TRUNC (MIR_op_t, temp_ops, 0);
    for (size_t i = 0; i < curr_func->nres; i++) { /* add absent ret */
      MIR_op_t op;
      if (curr_func->res_types[i] == MIR_T_F)
        op = MIR_new_float_op (ctx, 0.0f);
      else if (curr_func->res_types[i] == MIR_T_D)
        op = MIR_new_double_op (ctx, 0.0);
      else if (curr_func->res_types[i] == MIR_T_LD)
        op = MIR_new_ldouble_op (ctx, 0.0);
      else
        op = MIR_new_int_op (ctx, 0);
      VARR_PUSH (MIR_op_t, temp_ops, op);
    }
    MIR_append_insn (ctx, curr_func->func_item,
                     MIR_new_insn_arr (ctx, MIR_RET, curr_func->nres,
                                       VARR_ADDR (MIR_op_t, temp_ops)));
  }
  curr_func->expr_p = expr_p;
  curr_func->jret_p = jret_p;
  curr_func = NULL;
}